

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WLANOptimizer.cpp
# Opt level: O0

void __thiscall WLANOptimizerThread::Stop(WLANOptimizerThread *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  system_error *anon_var_0;
  unique_lock<std::mutex> wakeLocker;
  lock_guard<std::mutex> startStopLocker;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 8));
  if (bVar1) {
    std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffaf);
    std::unique_lock<std::mutex>::unique_lock
              (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bb00b);
    bVar1 = std::thread::joinable((thread *)in_RDI);
    if (bVar1) {
      std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1bb02a);
      std::thread::join();
    }
    std::shared_ptr<std::thread>::shared_ptr
              ((shared_ptr<std::thread> *)in_RDI,
               (nullptr_t)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    std::shared_ptr<std::thread>::operator=
              ((shared_ptr<std::thread> *)in_RDI,
               (shared_ptr<std::thread> *)
               CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x1bb0a7);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1bb0b5);
  return;
}

Assistant:

void WLANOptimizerThread::Stop()
{
    std::lock_guard<std::mutex> startStopLocker(StartStopLock);

    if (Thread)
    {
        Terminated = true;

        // Make sure that queue notification happens after termination flag is set
        {
            std::unique_lock<std::mutex> wakeLocker(WakeLock);
            WakeCondition.notify_all();
        }

        // Wait for thread to stop
        try
        {
            if (Thread->joinable()) {
                Thread->join();
            }
        }
        catch (std::system_error& /*err*/)
        {
        }

        Thread = nullptr;
    }
}